

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_preprocessor.c
# Opt level: O0

void handle_pp_error(Context_conflict1 *ctx)

{
  IncludeState *state_00;
  bool bVar1;
  Token TVar2;
  int iVar3;
  size_t sVar4;
  Token token;
  size_t prefixlen;
  char *prefix;
  int done;
  int cpy;
  int avail;
  char *ptr;
  IncludeState *state;
  Context_conflict1 *ctx_local;
  
  state_00 = ctx->include_stack;
  bVar1 = false;
  sVar4 = strlen("#error");
  strcpy(ctx->failstr,"#error");
  done = 0xff - (int)sVar4;
  state_00->report_whitespace = 1;
  _cpy = ctx->failstr + sVar4;
LAB_0014fcaa:
  do {
    while( true ) {
      if (bVar1) {
        *_cpy = '\0';
        state_00->report_whitespace = 0;
        ctx->isfail = 1;
        return;
      }
      TVar2 = lexer(state_00);
      if (TVar2 != 10) break;
      state_00->line = state_00->line - 1;
LAB_0014fd04:
      pushback(state_00);
      bVar1 = true;
    }
    if (TVar2 != 0x20) {
      if ((TVar2 == TOKEN_EOI) || (TVar2 == TOKEN_INCOMPLETE_COMMENT)) goto LAB_0014fd04;
      iVar3 = Min(done,state_00->tokenlen);
      if (iVar3 != 0) {
        memcpy(_cpy,state_00->token,(long)iVar3);
      }
      done = done - iVar3;
      _cpy = _cpy + iVar3;
      goto LAB_0014fcaa;
    }
    if (done != 0) {
      *_cpy = ' ';
      done = done + -1;
      _cpy = _cpy + 1;
    }
  } while( true );
}

Assistant:

static void handle_pp_error(Context *ctx)
{
    IncludeState *state = ctx->include_stack;
    char *ptr = ctx->failstr;
    int avail = sizeof (ctx->failstr) - 1;
    int cpy = 0;
    int done = 0;

    const char *prefix = "#error";
    const size_t prefixlen = strlen(prefix);
    strcpy(ctx->failstr, prefix);
    avail -= prefixlen;
    ptr += prefixlen;

    state->report_whitespace = 1;
    while (!done)
    {
        const Token token = lexer(state);
        switch (token)
        {
            case ((Token) '\n'):
                state->line--;  // make sure error is on the right line.
                // fall through!
            case TOKEN_INCOMPLETE_COMMENT:
            case TOKEN_EOI:
                pushback(state);  // move back so we catch this later.
                done = 1;
                break;

            case ((Token) ' '):
                if (!avail)
                    break;
                *(ptr++) = ' ';
                avail--;
                break;

            default:
                cpy = Min(avail, (int) state->tokenlen);
                if (cpy)
                    memcpy(ptr, state->token, cpy);
                ptr += cpy;
                avail -= cpy;
                break;
        } // switch
    } // while

    *ptr = '\0';
    state->report_whitespace = 0;
    ctx->isfail = 1;
}